

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

void kj::ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct(void *ptr)

{
  void *ptr_local;
  
  dtor<kj::StringTree::Branch>((Branch *)ptr);
  return;
}

Assistant:

static void destruct(void* ptr) {
    kj::dtor(*reinterpret_cast<T*>(ptr));
  }